

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QList<QString>_>_>::moveFromSpan
          (Span<QHashPrivate::Node<QString,_QList<QString>_>_> *this,
          Span<QHashPrivate::Node<QString,_QList<QString>_>_> *fromSpan,size_t fromIndex,size_t to)

{
  uchar *puVar1;
  uchar *puVar2;
  byte bVar3;
  Entry *pEVar4;
  Entry *pEVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uchar uVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar11 = this->nextFree;
  if (uVar11 == this->allocated) {
    addStorage(this);
    uVar11 = this->nextFree;
  }
  this->offsets[to] = uVar11;
  pEVar4 = this->entries;
  uVar12 = (ulong)((uint)this->nextFree * 0x30);
  this->nextFree = (pEVar4->storage).data[uVar12];
  bVar3 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  pEVar5 = fromSpan->entries;
  uVar13 = (ulong)((uint)bVar3 * 0x30);
  puVar1 = (pEVar5->storage).data + uVar13;
  uVar6 = *(undefined8 *)puVar1;
  uVar7 = *(undefined8 *)(puVar1 + 8);
  puVar1 = (pEVar5->storage).data + uVar13 + 0x10;
  uVar8 = *(undefined8 *)puVar1;
  uVar9 = *(undefined8 *)(puVar1 + 8);
  puVar1 = (pEVar5->storage).data + uVar13 + 0x20;
  uVar10 = *(undefined8 *)(puVar1 + 8);
  puVar2 = (pEVar4->storage).data + uVar12 + 0x20;
  *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
  *(undefined8 *)(puVar2 + 8) = uVar10;
  puVar1 = (pEVar4->storage).data + uVar12 + 0x10;
  *(undefined8 *)puVar1 = uVar8;
  *(undefined8 *)(puVar1 + 8) = uVar9;
  puVar1 = (pEVar4->storage).data + uVar12;
  *(undefined8 *)puVar1 = uVar6;
  *(undefined8 *)(puVar1 + 8) = uVar7;
  (pEVar5->storage).data[uVar13] = fromSpan->nextFree;
  fromSpan->nextFree = bVar3;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }